

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::finish_tree(CTcEmbedBuilderDbl *this,CTcPrsNode *cur)

{
  if (cur == (CTcPrsNode *)0x0) {
    cur = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    (cur->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR___cxa_pure_virtual_00358e80;
    cur[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x2cef19;
    cur[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    CTcGenTarg::note_str(G_cg,0);
    (cur->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00362cf0;
  }
  return cur;
}

Assistant:

virtual CTcPrsNode *finish_tree(CTcPrsNode *cur)
    {
        return (cur != 0 ? cur : new CTPNDstr("", 0));
    }